

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_profile_stop(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  ulong uVar3;
  GCobj *o;
  GCtab *t;
  TValue key;
  cTValue local_28;
  
  luaJIT_profile_stop(L);
  uVar1 = *(uint *)((ulong)(L->glref).ptr32 + 0x118);
  t = (GCtab *)(ulong)uVar1;
  local_28.n = -5.73116149175846e-322;
  pTVar2 = lj_tab_set(L,t,&local_28);
  (pTVar2->field_2).it = 0xffffffff;
  local_28.n = -5.03946958758071e-322;
  pTVar2 = lj_tab_set(L,t,&local_28);
  (pTVar2->field_2).it = 0xffffffff;
  if ((t->marked & 4) != 0) {
    uVar3 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar3 + 0x6c);
    *(uint *)(uVar3 + 0x6c) = uVar1;
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_profile_stop)
{
  GCtab *registry;
  TValue key;
  luaJIT_profile_stop(L);
  registry = tabV(registry(L));
  key.u64 = KEY_PROFILE_THREAD;
  setnilV(lj_tab_set(L, registry, &key));
  key.u64 = KEY_PROFILE_FUNC;
  setnilV(lj_tab_set(L, registry, &key));
  lj_gc_anybarriert(L, registry);
  return 0;
}